

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_process_short(int ticks,short *inBuffer,short *outBuffer)

{
  float *local_40;
  t_sample *p1;
  t_sample *p0;
  int local_28;
  int k;
  int j;
  int i;
  short *outBuffer_local;
  short *inBuffer_local;
  int ticks_local;
  
  sys_lock();
  sys_pollgui();
  _j = outBuffer;
  outBuffer_local = inBuffer;
  for (k = 0; k < ticks; k = k + 1) {
    local_28 = 0;
    p1 = (pd_maininstance.pd_stuff)->st_soundin;
    for (; local_28 < 0x40; local_28 = local_28 + 1) {
      local_40 = p1;
      for (p0._4_4_ = 0; p0._4_4_ < (pd_maininstance.pd_stuff)->st_inchannels;
          p0._4_4_ = p0._4_4_ + 1) {
        *local_40 = (float)(int)*outBuffer_local * 3.051851e-05;
        local_40 = local_40 + 0x40;
        outBuffer_local = outBuffer_local + 1;
      }
      p1 = p1 + 1;
    }
    memset((pd_maininstance.pd_stuff)->st_soundout,0,
           (long)((pd_maininstance.pd_stuff)->st_outchannels << 6) << 2);
    sched_tick();
    local_28 = 0;
    p1 = (pd_maininstance.pd_stuff)->st_soundout;
    for (; local_28 < 0x40; local_28 = local_28 + 1) {
      local_40 = p1;
      for (p0._4_4_ = 0; p0._4_4_ < (pd_maininstance.pd_stuff)->st_outchannels;
          p0._4_4_ = p0._4_4_ + 1) {
        *_j = (short)(int)(*local_40 * 32767.0);
        local_40 = local_40 + 0x40;
        _j = _j + 1;
      }
      p1 = p1 + 1;
    }
  }
  sys_unlock();
  return 0;
}

Assistant:

int libpd_process_short(const int ticks, const short *inBuffer, short *outBuffer) {
  PROCESS(* short_to_sample, * sample_to_short)
}